

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_SINGLE_COMBAT(effect_handler_context_t *context)

{
  chunk_conflict *pcVar1;
  undefined4 i1;
  uint32_t uVar2;
  wchar_t wVar3;
  monster *pmVar4;
  monster_conflict *pmVar5;
  char local_78 [8];
  char m_name [80];
  wchar_t old_idx;
  monster *mon;
  effect_handler_context_t *context_local;
  
  pmVar4 = target_get_monster();
  context->ident = true;
  if ((player->upkeep->arena_level & 1U) == 0) {
    if (pmVar4 == (monster *)0x0) {
      msg("No monster selected!");
      context_local._7_1_ = false;
    }
    else {
      m_name._76_4_ = pmVar4->midx;
      uVar2 = Rand_div(pmVar4->race->spell_power);
      if ((int)player->lev < (int)uVar2) {
        monster_desc(local_78,0x50,pmVar4,L'̀');
        msg("%s resists!",local_78);
        context_local._7_1_ = true;
      }
      else {
        if (m_name._76_4_ != 1) {
          pmVar5 = cave_monster(cave,L'\x01');
          i1 = m_name._76_4_;
          pcVar1 = cave;
          if (pmVar5->race == (monster_race *)0x0) {
            monster_index_move((chunk *)cave,m_name._76_4_,L'\x01');
          }
          else {
            wVar3 = cave_monster_max(cave);
            monster_index_move((chunk *)pcVar1,i1,wVar3);
            monster_index_move((chunk *)cave,L'\x01',m_name._76_4_);
            pcVar1 = cave;
            wVar3 = cave_monster_max(cave);
            monster_index_move((chunk *)pcVar1,wVar3,L'\x01');
          }
        }
        pmVar4 = (monster *)cave_monster(cave,L'\x01');
        target_set_monster(pmVar4);
        pmVar4 = (monster *)cave_monster(cave,L'\x01');
        player->upkeep->health_who = pmVar4;
        player->upkeep->arena_level = true;
        player->old_grid = player->grid;
        dungeon_change_level(player,(int)player->depth);
        context_local._7_1_ = true;
      }
    }
  }
  else {
    msg("You are already in single combat!");
    context_local._7_1_ = false;
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_SINGLE_COMBAT(effect_handler_context_t *context)
{
	struct monster *mon = target_get_monster();
	context->ident = true;

	/* Already in an arena */
	if (player->upkeep->arena_level) {
		msg("You are already in single combat!");
		return false;
	}

	/* Need to choose a monster, not just point */
	if (mon) {
		int old_idx = mon->midx;

		/* Monsters with high spell power can resist */
		if (randint0(mon->race->spell_power) > player->lev) {
			char m_name[80];
			monster_desc(m_name, sizeof(m_name), mon,
				MDESC_CAPITAL | MDESC_COMMA);
			msg("%s resists!", m_name);
			return true;
		}

		/* Swap the targeted monster with the first in the monster list */
		if (old_idx == 1) {
			/* Do nothing */
			;
		} else if (cave_monster(cave, 1)->race) {
			monster_index_move(cave, old_idx, cave_monster_max(cave));
			monster_index_move(cave, 1, old_idx);
			monster_index_move(cave, cave_monster_max(cave), 1);
		} else {
			monster_index_move(cave, old_idx, 1);
		}
		target_set_monster(cave_monster(cave, 1));
		player->upkeep->health_who = cave_monster(cave, 1);
	} else {
		msg("No monster selected!");
		return false;
	}

	/* Head to the arena */
	player->upkeep->arena_level = true;
	player->old_grid = player->grid;
	dungeon_change_level(player, player->depth);
	return true;
}